

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

void __thiscall Func::SetFirstArgOffset(Func *this,Instr *inlineeStart)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  Instr *this_00;
  Opnd *pOVar5;
  SymOpnd *pSVar6;
  StackSym *pSVar7;
  Func *this_01;
  JITTimeFunctionBody *this_02;
  int32 firstActualStackOffset;
  int32 secondLastOffset;
  Opnd *secondLastArgOutOpnd;
  StackSym *lastArgOutStackSym;
  Instr *arg;
  int32 lastOffset;
  Instr *inlineeStart_local;
  Func *this_local;
  
  if (inlineeStart->m_func != this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x301,"(inlineeStart->m_func == this)","inlineeStart->m_func == this");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = IsTopFunc(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x302,"(!IsTopFunc())","!IsTopFunc()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_00 = IR::Instr::GetNextArg(inlineeStart);
  if (this_00 == (Instr *)0x0) {
    this_01 = GetTopFunc(this);
    this_02 = GetJITFunctionBody(this_01);
    bVar2 = JITTimeFunctionBody::IsAsmJsMode(this_02);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x318,"(this->GetTopFunc()->GetJITFunctionBody()->IsAsmJsMode())",
                         "this->GetTopFunc()->GetJITFunctionBody()->IsAsmJsMode()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    arg._4_4_ = 8;
  }
  else {
    pOVar5 = IR::Instr::GetDst(this_00);
    pSVar6 = IR::Opnd::AsSymOpnd(pOVar5);
    pSVar7 = Sym::AsStackSym(pSVar6->m_sym);
    arg._4_4_ = pSVar7->m_offset;
    if ((*(uint *)&pSVar7->field_0x18 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x30a,"(lastArgOutStackSym->m_isSingleDef)",
                         "lastArgOutStackSym->m_isSingleDef");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pOVar5 = IR::Instr::GetSrc2((pSVar7->field_5).m_instrDef);
    bVar2 = IR::Opnd::IsSymOpnd(pOVar5);
    if (bVar2) {
      pSVar6 = IR::Opnd::AsSymOpnd(pOVar5);
      pSVar7 = Sym::AsStackSym(pSVar6->m_sym);
      if (arg._4_4_ < pSVar7->m_offset) {
        arg._4_4_ = pSVar7->m_offset;
      }
    }
    arg._4_4_ = arg._4_4_ + 8;
  }
  iVar3 = arg._4_4_ + (this->actualCount + 3) * -8;
  if ((this->firstActualStackOffset != -1) && (this->firstActualStackOffset != iVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x31c,
                       "((this->firstActualStackOffset == -1) || (this->firstActualStackOffset == firstActualStackOffset))"
                       ,
                       "(this->firstActualStackOffset == -1) || (this->firstActualStackOffset == firstActualStackOffset)"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this->firstActualStackOffset = iVar3;
  return;
}

Assistant:

void Func::SetFirstArgOffset(IR::Instr* inlineeStart)
{
    Assert(inlineeStart->m_func == this);
    Assert(!IsTopFunc());
    int32 lastOffset;

    IR::Instr* arg = inlineeStart->GetNextArg();
    if (arg)
    {
        const auto lastArgOutStackSym = arg->GetDst()->AsSymOpnd()->m_sym->AsStackSym();
        lastOffset = lastArgOutStackSym->m_offset;
        Assert(lastArgOutStackSym->m_isSingleDef);
        const auto secondLastArgOutOpnd = lastArgOutStackSym->m_instrDef->GetSrc2();
        if (secondLastArgOutOpnd->IsSymOpnd())
        {
            const auto secondLastOffset = secondLastArgOutOpnd->AsSymOpnd()->m_sym->AsStackSym()->m_offset;
            if (secondLastOffset > lastOffset)
            {
                lastOffset = secondLastOffset;
            }
        }
        lastOffset += MachPtr;
    }
    else
    {
        Assert(this->GetTopFunc()->GetJITFunctionBody()->IsAsmJsMode());
        lastOffset = MachPtr;
    }
    int32 firstActualStackOffset = lastOffset - ((this->actualCount + Js::Constants::InlineeMetaArgCount) * MachPtr);
    Assert((this->firstActualStackOffset == -1) || (this->firstActualStackOffset == firstActualStackOffset));
    this->firstActualStackOffset = firstActualStackOffset;
}